

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O3

Slice __thiscall arangodb::velocypack::ObjectIterator::value(ObjectIterator *this)

{
  ulong uVar1;
  Slice SVar2;
  byte *pbVar3;
  Slice key;
  byte *pbStack_30;
  byte *local_10;
  
  if (this->_position == this->_size) {
    value();
    SVar2._start = (uint8_t *)this->_position;
    if (SVar2._start != (uint8_t *)this->_size) {
      SVar2._start = SVar2._start + 1;
      this->_position = (ValueLength)SVar2._start;
      pbStack_30 = this->_current;
      if (pbStack_30 != (byte *)0x0) {
        uVar1 = (ulong)"\x01\x01"[*pbStack_30];
        if (uVar1 == 0) {
          uVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&pbStack_30,pbStack_30);
          pbStack_30 = this->_current;
        }
        pbVar3 = pbStack_30 + uVar1;
        this->_current = pbVar3;
        SVar2._start = (uint8_t *)(ulong)"\x01\x01"[pbStack_30[uVar1]];
        if (SVar2._start == (uint8_t *)0x0) {
          pbStack_30 = pbVar3;
          SVar2._start = (uint8_t *)
                         SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                         byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                          *)&pbStack_30,pbVar3);
          pbVar3 = this->_current;
        }
        this->_current = pbVar3 + (long)SVar2._start;
      }
    }
    return (Slice)SVar2._start;
  }
  pbVar3 = this->_current;
  if (pbVar3 != (byte *)0x0) {
    uVar1 = (ulong)"\x01\x01"[*pbVar3];
    if (uVar1 == 0) {
      local_10 = pbVar3;
      uVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_10,pbVar3);
    }
    return (Slice)(pbVar3 + uVar1);
  }
  SVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getNthValue
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this,
                     this->_position);
  return (Slice)SVar2._start;
}

Assistant:

[[nodiscard]] Slice key(bool translate = true) const {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      throw Exception{Exception::IndexOutOfBounds};
    }
    if (_current != nullptr) {
      Slice s{_current};
      return translate ? s.makeKey() : s;
    }
    return _slice.getNthKey(_position, translate);
  }